

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::processBrokerDisconnect
          (CoreBroker *this,ActionMessage *command,BasicBrokerInfo *brk)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pBVar3;
  string_view message;
  string_view message_00;
  ConnectionState CVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer pBVar5;
  string_view fmt;
  format_args args;
  string_view name;
  string_view name_00;
  ActionMessage dis;
  string local_50;
  
  if (((this->super_BrokerBase).field_0x294 == '\0') &&
     ((command->source_id).gid == (this->super_BrokerBase).higher_broker_id.gid)) {
    if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
      message._M_str = "got disconnect from parent";
      message._M_len = 0x1a;
      name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger(&this->super_BrokerBase,(GlobalFederateId)0x0,9,name,message,false);
    }
    sendDisconnect(this,cmd_global_disconnect);
    ActionMessage::ActionMessage(&dis,cmd_stop);
    BrokerBase::addActionMessage(&this->super_BrokerBase,&dis);
  }
  else {
    if (brk != (BasicBrokerInfo *)0x0) {
      if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        pcVar1 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar2 = (this->super_BrokerBase).identifier._M_string_length;
        dis.dest_id.gid = (command->source_id).gid;
        dis._0_8_ = (brk->name)._M_dataplus._M_p;
        dis._8_8_ = (brk->name)._M_string_length;
        fmt.size_ = 0x1d;
        fmt.data_ = (char *)0x1a;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&dis;
        ::fmt::v11::vformat_abi_cxx11_(&local_50,(v11 *)"got disconnect from {}({})",fmt,args);
        message_00._M_str = local_50._M_dataplus._M_p;
        message_00._M_len = local_50._M_string_length;
        name_00._M_str = pcVar1;
        name_00._M_len = sVar2;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,(GlobalFederateId)0x0,9,name_00,message_00,false);
        std::__cxx11::string::~string((string *)&local_50);
      }
      disconnectBroker(this,brk);
    }
    CVar4 = getAllConnectionState(this);
    if (CVar4 < DISCONNECTED) {
      if ((brk != (BasicBrokerInfo *)0x0) && (brk->_nonLocal == false)) {
        if ((this->super_BrokerBase).globalDisconnect == false) {
          if ((command->flags & 0x10) == 0) {
            ActionMessage::ActionMessage(&dis,(uint)brk->_core ^ cmd_disconnect_broker_ack);
            dis.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
            dis.dest_id.gid = (brk->global_id).gid;
            (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)(brk->route).rid,&dis);
            ActionMessage::~ActionMessage(&dis);
          }
          brk->_sent_disconnect_ack = true;
        }
        if (((this->super_BrokerBase).field_0x294 == '\0') &&
           ((this->super_BrokerBase).brokerState._M_i < OPERATING)) {
          ActionMessage::setAction(command,(uint)brk->_core ^ cmd_disconnect_broker);
          (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
        }
        if ((this->super_BrokerBase).globalDisconnect != false) {
          return;
        }
        (*(this->super_Broker)._vptr_Broker[0x25])(this,(ulong)(uint)(brk->route).rid);
        return;
      }
      if ((this->super_BrokerBase).field_0x294 != '\0') {
        return;
      }
      if (brk == (BasicBrokerInfo *)0x0) {
        return;
      }
      if (INITIALIZING < (this->super_BrokerBase).brokerState._M_i) {
        return;
      }
      ActionMessage::setAction(command,(uint)brk->_core ^ cmd_disconnect_broker);
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
      return;
    }
    BaseTimeCoordinator::disconnect
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    if ((this->super_BrokerBase).field_0x294 == '\0') {
      ActionMessage::ActionMessage(&dis,cmd_disconnect);
      dis.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&dis);
    }
    else {
      if ((brk != (BasicBrokerInfo *)0x0) && (brk->_nonLocal == false)) {
        if ((this->super_BrokerBase).globalDisconnect == true) {
          pBVar3 = (this->mBrokers).dataStorage.
                   super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pBVar5 = (this->mBrokers).dataStorage.
                        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start; pBVar5 != pBVar3;
              pBVar5 = pBVar5 + 1) {
            if (pBVar5->_sent_disconnect_ack == false) {
              ActionMessage::ActionMessage(&dis,(uint)pBVar5->_core ^ cmd_disconnect_broker_ack);
              dis.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
              dis.dest_id.gid = (pBVar5->global_id).gid;
              (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)(pBVar5->route).rid,&dis)
              ;
              pBVar5->_sent_disconnect_ack = true;
              (*(this->super_Broker)._vptr_Broker[0x25])(this,(ulong)(uint)(pBVar5->route).rid);
              ActionMessage::~ActionMessage(&dis);
            }
          }
        }
        else {
          if ((command->flags & 0x10) == 0) {
            ActionMessage::ActionMessage(&dis,(uint)brk->_core ^ cmd_disconnect_broker_ack);
            dis.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
            dis.dest_id.gid = (brk->global_id).gid;
            (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)(brk->route).rid,&dis);
            ActionMessage::~ActionMessage(&dis);
          }
          brk->_sent_disconnect_ack = true;
          (*(this->super_Broker)._vptr_Broker[0x25])(this,(ulong)(uint)(brk->route).rid);
        }
      }
      ActionMessage::ActionMessage(&dis,cmd_stop);
      BrokerBase::addActionMessage(&this->super_BrokerBase,&dis);
    }
  }
  ActionMessage::~ActionMessage(&dis);
  return;
}

Assistant:

void CoreBroker::processBrokerDisconnect(ActionMessage& command, BasicBrokerInfo* brk)
{
    if (!isRootc) {
        if (command.source_id == higher_broker_id) {
            LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "got disconnect from parent");
            sendDisconnect(CMD_GLOBAL_DISCONNECT);
            addActionMessage(CMD_STOP);
            return;
        }
    }

    if (brk != nullptr) {
        LOG_CONNECTIONS(parent_broker_id,
                        getIdentifier(),
                        fmt::format("got disconnect from {}({})",
                                    brk->name,
                                    command.source_id.baseValue()));
        disconnectBroker(*brk);
    }

    if ((getAllConnectionState() >= ConnectionState::DISCONNECTED)) {
        timeCoord->disconnect();
        if (!isRootc) {
            ActionMessage dis(CMD_DISCONNECT);
            dis.source_id = global_broker_id_local;
            transmit(parent_route_id, dis);
        } else {
            if ((brk != nullptr) && (!brk->_nonLocal)) {
                if (globalDisconnect) {
                    mBrokers.apply([this](auto& broker) {
                        if (!broker._sent_disconnect_ack) {
                            ActionMessage dis((broker._core) ? CMD_DISCONNECT_CORE_ACK :
                                                               CMD_DISCONNECT_BROKER_ACK);
                            dis.source_id = global_broker_id_local;
                            dis.dest_id = broker.global_id;
                            this->transmit(broker.route, dis);
                            broker._sent_disconnect_ack = true;
                            this->removeRoute(broker.route);
                        }
                    });
                } else {
                    if (!checkActionFlag(command, error_flag)) {
                        ActionMessage dis((brk->_core) ? CMD_DISCONNECT_CORE_ACK :
                                                         CMD_DISCONNECT_BROKER_ACK);
                        dis.source_id = global_broker_id_local;
                        dis.dest_id = brk->global_id;
                        transmit(brk->route, dis);
                    }
                    brk->_sent_disconnect_ack = true;
                    removeRoute(brk->route);
                }
            }
            addActionMessage(CMD_STOP);
        }
    } else {
        if ((brk != nullptr) && (!brk->_nonLocal)) {
            if (!globalDisconnect) {
                if (!checkActionFlag(command, error_flag)) {
                    ActionMessage dis((brk->_core) ? CMD_DISCONNECT_CORE_ACK :
                                                     CMD_DISCONNECT_BROKER_ACK);
                    dis.source_id = global_broker_id_local;
                    dis.dest_id = brk->global_id;
                    transmit(brk->route, dis);
                }
                brk->_sent_disconnect_ack = true;
            }
            if ((!isRootc) && (getBrokerState() < BrokerState::OPERATING)) {
                command.setAction((brk->_core) ? CMD_DISCONNECT_CORE : CMD_DISCONNECT_BROKER);
                transmit(parent_route_id, command);
            }
            if (!globalDisconnect) {
                removeRoute(brk->route);
            }
        } else {
            if ((!isRootc) && (getBrokerState() < BrokerState::OPERATING)) {
                if (brk != nullptr) {
                    command.setAction((brk->_core) ? CMD_DISCONNECT_CORE : CMD_DISCONNECT_BROKER);
                    transmit(parent_route_id, command);
                }
            }
        }
    }
}